

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O1

OPJ_BOOL opj_tcd_update_tile_data(opj_tcd_t *p_tcd,OPJ_BYTE *p_dest,OPJ_UINT32 p_dest_length)

{
  OPJ_BYTE OVar1;
  undefined2 uVar2;
  opj_tcd_resolution_t *poVar3;
  OPJ_UINT32 OVar4;
  OPJ_BOOL OVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  opj_tcd_resolution_t *poVar9;
  long lVar10;
  opj_tcd_tilecomp_t *poVar11;
  opj_image_comp_t *poVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  OPJ_BYTE *__src;
  
  OVar4 = opj_tcd_get_decoded_tile_size(p_tcd,1);
  OVar5 = 0;
  if (OVar4 <= p_dest_length && OVar4 != 0xffffffff) {
    if (p_tcd->image->numcomps != 0) {
      poVar12 = p_tcd->image->comps;
      poVar11 = p_tcd->tcd_image->tiles->comps;
      uVar13 = 0;
      do {
        poVar3 = poVar11->resolutions;
        poVar9 = poVar3 + poVar12->resno_decoded;
        if (p_tcd->whole_tile_decoding == 0) {
          uVar6 = poVar9->win_x1 - poVar9->win_x0;
          iVar15 = poVar9->win_y1 - poVar9->win_y0;
          uVar14 = 0;
          lVar10 = 0x50;
        }
        else {
          uVar6 = poVar9->x1 - poVar9->x0;
          iVar15 = poVar9->y1 - poVar9->y0;
          uVar8 = poVar11->minimum_num_resolutions - 1;
          uVar14 = (ulong)(poVar3[uVar8].x1 - (poVar3[uVar8].x0 + uVar6));
          lVar10 = 0x30;
        }
        __src = *(OPJ_BYTE **)((long)&poVar11->x0 + lVar10);
        iVar7 = ((poVar12->prec >> 3) + 1) - (uint)((poVar12->prec & 7) == 0);
        if (iVar7 == 3) {
          iVar7 = 4;
        }
        if (iVar7 == 1) {
          if (poVar12->sgnd == 0) {
            if (iVar15 != 0) {
              iVar7 = 0;
              uVar8 = uVar6;
              do {
                for (; uVar8 != 0; uVar8 = uVar8 - 1) {
                  OVar1 = *__src;
                  __src = __src + 4;
                  *p_dest = OVar1;
                  p_dest = p_dest + 1;
                }
                __src = __src + uVar14 * 4;
                iVar7 = iVar7 + 1;
                uVar8 = uVar6;
              } while (iVar7 != iVar15);
            }
          }
          else if (iVar15 != 0) {
            iVar7 = 0;
            uVar8 = uVar6;
            do {
              for (; uVar8 != 0; uVar8 = uVar8 - 1) {
                OVar1 = *__src;
                __src = __src + 4;
                *p_dest = OVar1;
                p_dest = p_dest + 1;
              }
              __src = __src + uVar14 * 4;
              iVar7 = iVar7 + 1;
              uVar8 = uVar6;
            } while (iVar7 != iVar15);
          }
        }
        else if (iVar7 == 2) {
          if (poVar12->sgnd == 0) {
            if (iVar15 != 0) {
              iVar7 = 0;
              uVar8 = uVar6;
              do {
                for (; uVar8 != 0; uVar8 = uVar8 - 1) {
                  uVar2 = *(undefined2 *)__src;
                  __src = __src + 4;
                  *(undefined2 *)p_dest = uVar2;
                  p_dest = p_dest + 2;
                }
                __src = __src + uVar14 * 4;
                iVar7 = iVar7 + 1;
                uVar8 = uVar6;
              } while (iVar7 != iVar15);
            }
          }
          else if (iVar15 != 0) {
            iVar7 = 0;
            uVar8 = uVar6;
            do {
              for (; uVar8 != 0; uVar8 = uVar8 - 1) {
                uVar2 = *(undefined2 *)__src;
                __src = __src + 4;
                *(undefined2 *)p_dest = uVar2;
                p_dest = p_dest + 2;
              }
              __src = __src + uVar14 * 4;
              iVar7 = iVar7 + 1;
              uVar8 = uVar6;
            } while (iVar7 != iVar15);
          }
        }
        else if ((iVar7 == 4) && (iVar15 != 0)) {
          do {
            memcpy(p_dest,__src,(ulong)uVar6 * 4);
            __src = __src + (ulong)((int)uVar14 + uVar6) * 4;
            p_dest = p_dest + (ulong)uVar6 * 4;
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
        }
        poVar12 = poVar12 + 1;
        poVar11 = poVar11 + 1;
        uVar13 = uVar13 + 1;
      } while (uVar13 < p_tcd->image->numcomps);
    }
    OVar5 = 1;
  }
  return OVar5;
}

Assistant:

OPJ_BOOL opj_tcd_update_tile_data(opj_tcd_t *p_tcd,
                                  OPJ_BYTE * p_dest,
                                  OPJ_UINT32 p_dest_length
                                 )
{
    OPJ_UINT32 i, j, k, l_data_size = 0;
    opj_image_comp_t * l_img_comp = 00;
    opj_tcd_tilecomp_t * l_tilec = 00;
    opj_tcd_resolution_t * l_res;
    OPJ_UINT32 l_size_comp, l_remaining;
    OPJ_UINT32 l_stride, l_width, l_height;

    l_data_size = opj_tcd_get_decoded_tile_size(p_tcd, OPJ_TRUE);
    if (l_data_size == UINT_MAX || l_data_size > p_dest_length) {
        return OPJ_FALSE;
    }

    l_tilec = p_tcd->tcd_image->tiles->comps;
    l_img_comp = p_tcd->image->comps;

    for (i = 0; i < p_tcd->image->numcomps; ++i) {
        const OPJ_INT32* l_src_data;
        l_size_comp = l_img_comp->prec >> 3; /*(/ 8)*/
        l_remaining = l_img_comp->prec & 7;  /* (%8) */
        l_res = l_tilec->resolutions + l_img_comp->resno_decoded;
        if (p_tcd->whole_tile_decoding) {
            l_width = (OPJ_UINT32)(l_res->x1 - l_res->x0);
            l_height = (OPJ_UINT32)(l_res->y1 - l_res->y0);
            l_stride = (OPJ_UINT32)(l_tilec->resolutions[l_tilec->minimum_num_resolutions -
                                                                     1].x1 -
                                    l_tilec->resolutions[l_tilec->minimum_num_resolutions - 1].x0) - l_width;
            l_src_data = l_tilec->data;
        } else {
            l_width = l_res->win_x1 - l_res->win_x0;
            l_height = l_res->win_y1 - l_res->win_y0;
            l_stride = 0;
            l_src_data = l_tilec->data_win;
        }

        if (l_remaining) {
            ++l_size_comp;
        }

        if (l_size_comp == 3) {
            l_size_comp = 4;
        }

        switch (l_size_comp) {
        case 1: {
            OPJ_CHAR * l_dest_ptr = (OPJ_CHAR *) p_dest;
            const OPJ_INT32 * l_src_ptr = l_src_data;

            if (l_img_comp->sgnd) {
                for (j = 0; j < l_height; ++j) {
                    for (k = 0; k < l_width; ++k) {
                        *(l_dest_ptr++) = (OPJ_CHAR)(*(l_src_ptr++));
                    }
                    l_src_ptr += l_stride;
                }
            } else {
                for (j = 0; j < l_height; ++j) {
                    for (k = 0; k < l_width; ++k) {
                        *(l_dest_ptr++) = (OPJ_CHAR)((*(l_src_ptr++)) & 0xff);
                    }
                    l_src_ptr += l_stride;
                }
            }

            p_dest = (OPJ_BYTE *)l_dest_ptr;
        }
        break;
        case 2: {
            const OPJ_INT32 * l_src_ptr = l_src_data;
            OPJ_INT16 * l_dest_ptr = (OPJ_INT16 *) p_dest;

            if (l_img_comp->sgnd) {
                for (j = 0; j < l_height; ++j) {
                    for (k = 0; k < l_width; ++k) {
                        OPJ_INT16 val = (OPJ_INT16)(*(l_src_ptr++));
                        memcpy(l_dest_ptr, &val, sizeof(val));
                        l_dest_ptr ++;
                    }
                    l_src_ptr += l_stride;
                }
            } else {
                for (j = 0; j < l_height; ++j) {
                    for (k = 0; k < l_width; ++k) {
                        OPJ_INT16 val = (OPJ_INT16)((*(l_src_ptr++)) & 0xffff);
                        memcpy(l_dest_ptr, &val, sizeof(val));
                        l_dest_ptr ++;
                    }
                    l_src_ptr += l_stride;
                }
            }

            p_dest = (OPJ_BYTE*) l_dest_ptr;
        }
        break;
        case 4: {
            OPJ_INT32 * l_dest_ptr = (OPJ_INT32 *) p_dest;
            const OPJ_INT32 * l_src_ptr = l_src_data;

            for (j = 0; j < l_height; ++j) {
                memcpy(l_dest_ptr, l_src_ptr, l_width * sizeof(OPJ_INT32));
                l_dest_ptr += l_width;
                l_src_ptr += l_width + l_stride;
            }

            p_dest = (OPJ_BYTE*) l_dest_ptr;
        }
        break;
        }

        ++l_img_comp;
        ++l_tilec;
    }

    return OPJ_TRUE;
}